

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

void Gia_ManWriteMiniLut(Gia_Man_t *pGia,char *pFileName)

{
  Mini_Lut_t *p;
  FILE *__s;
  byte bVar1;
  
  p = Gia_ManToMiniLut(pGia);
  __s = fopen(pFileName,"wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open file for writing \"%s\".\n",pFileName);
  }
  else {
    fwrite(&p->nSize,4,1,__s);
    fwrite(&p->nRegs,4,1,__s);
    fwrite(&p->LutSize,4,1,__s);
    fwrite(p->pArray,4,(long)p->LutSize * (long)p->nSize,__s);
    bVar1 = (char)p->LutSize - 5;
    if (p->LutSize < 6) {
      bVar1 = 0;
    }
    fwrite(p->pTruths,4,(long)(p->nSize << (bVar1 & 0x1f)),__s);
    fclose(__s);
  }
  Mini_LutStop(p);
  return;
}

Assistant:

void Gia_ManWriteMiniLut( Gia_Man_t * pGia, char * pFileName )
{
    Mini_Lut_t * p = Gia_ManToMiniLut( pGia );
    Mini_LutDump( p, pFileName );
    Mini_LutStop( p );
}